

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char,char_const*&>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,
                   char (*b) [20],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char *args_1,char **args_2)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_1d8;
  cmAlphaNum local_1a0;
  cmAlphaNum local_168;
  cmAlphaNum local_130;
  cmAlphaNum local_f8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  char **local_38;
  char **args_local_2;
  char *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char (*b_local) [20];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a_local;
  
  local_38 = args_2;
  args_local_2 = (char **)args_1;
  args_local_1 = (char *)args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b;
  b_local = (char (*) [20])a;
  a_local = __return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_f8,a);
  cmStrCat<std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char,char_const*&>(std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char&&,char_const*&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_c0,
             &cmStrCat<std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char,char_const*&>(std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char&&,char_const*&)
              ::makePair,&local_f8);
  cmAlphaNum::cmAlphaNum(&local_130,(char *)args_local);
  cmStrCat<std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char,char_const*&>(std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char&&,char_const*&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char,char_const*&>(std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char&&,char_const*&)
              ::makePair,&local_130);
  cmAlphaNum::cmAlphaNum(&local_168,(string *)args_local_1);
  cmStrCat<std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char,char_const*&>(std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char&&,char_const*&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char,char_const*&>(std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char&&,char_const*&)
              ::makePair,&local_168);
  cmAlphaNum::cmAlphaNum(&local_1a0,*(char *)args_local_2);
  cmStrCat<std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char,char_const*&>(std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char&&,char_const*&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char,char_const*&>(std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char&&,char_const*&)
              ::makePair,&local_1a0);
  cmAlphaNum::cmAlphaNum(&local_1d8,*local_38);
  cmStrCat<std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char,char_const*&>(std::__cxx11::string&,char_const(&)[20],std::__cxx11::string&&,char&&,char_const*&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<std::__cxx11::string&,char_const(&)[20],std::__cxx11::string,char,char_const*&>(std::__cxx11::string&,char_const&[],std::__cxx11::string&&,char&&,char_const*&)
              ::makePair,&local_1d8);
  local_48 = &local_c0;
  local_40 = 5;
  views._M_len = 5;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}